

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::ByteSizeLong(VisionFeaturePrint *this)

{
  VisionFeaturePrintTypeCase VVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  VisionFeaturePrint *this_local;
  
  sStack_18 = 0;
  VVar1 = VisionFeaturePrintType_case(this);
  if (VVar1 != VISIONFEATUREPRINTTYPE_NOT_SET) {
    if (VVar1 == kScene) {
      sStack_18 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>
                            ((this->VisionFeaturePrintType_).scene_);
      sStack_18 = sStack_18 + 2;
    }
    else if (VVar1 == kObjects) {
      sStack_18 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>
                            ((this->VisionFeaturePrintType_).objects_);
      sStack_18 = sStack_18 + 2;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t VisionFeaturePrint::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  size_t total_size = 0;

  switch (VisionFeaturePrintType_case()) {
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene scene = 20;
    case kScene: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *VisionFeaturePrintType_.scene_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects objects = 21;
    case kObjects: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *VisionFeaturePrintType_.objects_);
      break;
    }
    case VISIONFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}